

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

ValueType * __thiscall
HighsHashTree<int,_int>::InnerLeaf<2>::find_entry
          (InnerLeaf<2> *this,uint64_t fullHash,int hashPos,int *key)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar8 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = uVar8 >> 10;
  uVar1 = (this->occupation).occupation;
  if ((uVar1 >> (uVar2 & 0x3f) & 1) == 0) {
    return (ValueType *)0x0;
  }
  uVar8 = uVar8 & 0xffff;
  lVar6 = POPCOUNT(uVar1 >> ((byte)uVar2 & 0x3f));
  do {
    lVar5 = lVar6;
    lVar6 = lVar5 + 1;
  } while (uVar8 < (this->hashes)._M_elems[lVar5 + -1]);
  iVar7 = this->size;
  if ((iVar7 + 2 == (int)lVar6) || ((this->hashes)._M_elems[lVar5 + -1] != uVar8)) {
    bVar9 = false;
    iVar7 = (int)lVar5 + -1;
  }
  else {
    do {
      bVar9 = *key == (this->entries)._M_elems[lVar6 + -2].key_;
      if (bVar9) {
        iVar7 = (int)lVar6 + -2;
        goto LAB_0027a07e;
      }
      if (iVar7 + 1 == (int)lVar6) goto LAB_0027a07e;
      lVar5 = lVar6 + 1;
      lVar3 = lVar6 + -1;
      lVar6 = lVar5;
    } while ((this->hashes)._M_elems[lVar3] == uVar8);
    iVar7 = (int)lVar5 + -2;
  }
LAB_0027a07e:
  piVar4 = (int *)0x0;
  if (bVar9) {
    piVar4 = &(this->entries)._M_elems[iVar7].value_;
  }
  return piVar4;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }